

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O0

void __thiscall LLVMBC::StreamState::append(StreamState *this,AllocaInst *alloca,bool decl)

{
  Type *type;
  PointerType *this_00;
  uint64_t local_38;
  Type *local_30;
  uint64_t local_28;
  undefined1 local_19;
  AllocaInst *pAStack_18;
  bool decl_local;
  AllocaInst *alloca_local;
  StreamState *this_local;
  
  local_19 = decl;
  pAStack_18 = alloca;
  alloca_local = (AllocaInst *)this;
  if (decl) {
    local_28 = Value::get_tween_id((Value *)alloca);
    type = Value::getType((Value *)pAStack_18);
    this_00 = cast<LLVMBC::PointerType>(type);
    local_30 = PointerType::getElementType(this_00);
    append<char_const(&)[2],unsigned_long,char_const(&)[11],LLVMBC::Type*>
              (this,(char (*) [2])0x2a90be,&local_28,(char (*) [11])" = alloca ",&local_30);
  }
  else {
    local_38 = Value::get_tween_id((Value *)alloca);
    append<char_const(&)[2],unsigned_long>(this,(char (*) [2])0x2a90be,&local_38);
  }
  return;
}

Assistant:

void StreamState::append(AllocaInst *alloca, bool decl)
{
	if (decl)
	{
		append("%", alloca->get_tween_id(), " = alloca ", cast<PointerType>(alloca->getType())->getElementType());
	}
	else
	{
		append("%", alloca->get_tween_id());
	}
}